

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O2

UserObject * __thiscall camp::UserObject::operator=(UserObject *this,UserObject *other)

{
  ParentObject *pPVar1;
  ParentObject *pPVar2;
  ParentObject *pPVar3;
  ParentObject *tmp;
  
  if ((other->m_parent).px == (ParentObject *)0x0) {
    pPVar1 = (ParentObject *)0x0;
  }
  else {
    pPVar1 = (ParentObject *)operator_new(0x58);
    pPVar2 = boost::scoped_ptr<camp::ParentObject>::operator->(&other->m_parent);
    pPVar3 = boost::scoped_ptr<camp::ParentObject>::operator->(&other->m_parent);
    ParentObject::ParentObject(pPVar1,&pPVar2->object,pPVar3->member);
  }
  this->m_class = other->m_class;
  std::__shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_holder).
              super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>,
             &(other->m_holder).
              super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>);
  pPVar2 = (this->m_parent).px;
  (this->m_parent).px = pPVar1;
  this->m_child = (UserObject *)0x0;
  if (pPVar1 != (ParentObject *)0x0) {
    pPVar1 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
    (pPVar1->object).m_child = this;
  }
  boost::checked_delete<camp::ParentObject>(pPVar2);
  return this;
}

Assistant:

UserObject& UserObject::operator=(const UserObject& other)
{
    boost::scoped_ptr<ParentObject> parent(other.m_parent ? new ParentObject(other.m_parent->object, other.m_parent->member) : 0);

    m_class = other.m_class;
    m_holder = other.m_holder;
    m_parent.swap(parent);
    m_child = 0;

    if (m_parent)
        m_parent->object.m_child = this;

    return *this;
}